

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

char * pp_get_token(void)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  pcVar6 = (char *)0x0;
  if ((l != -1) && (l != 10)) {
    do {
      readbyte();
      if ((l == -1) || (l == 10)) break;
      ppuVar3 = __ctype_b_loc();
    } while ((*(byte *)((long)*ppuVar3 + (long)c * 2 + 1) & 0x20) != 0);
    ppuVar3 = __ctype_b_loc();
    iVar1 = c;
    pcVar6 = (char *)0x0;
    if (((long)c != -1) && (((*ppuVar3)[c] & 0x2000) == 0)) {
      eline = line;
      ecolumn = column;
      iVar5 = 0;
      if (c == 0x22) {
        iVar5 = 0x22;
      }
      pp_get_token::buf[0] = (char)c;
      pcVar6 = pp_get_token::buf + 1;
      iVar4 = 1;
      do {
        if ((((long)l == -1) || (l == 10)) ||
           ((iVar1 != 0x22 && ((*(byte *)((long)*ppuVar3 + (long)l * 2 + 1) & 0x20) != 0)))) break;
        readbyte();
        iVar2 = c;
        if (iVar4 < 0x3ff) {
          *pcVar6 = (char)c;
          pcVar6 = pcVar6 + 1;
          iVar4 = iVar4 + 1;
        }
      } while (iVar2 != iVar5 || iVar1 != 0x22);
      *pcVar6 = '\0';
      pcVar6 = pp_get_token::buf;
      if (0x3fe < iVar4) {
        ccerr(F,"too long line directive");
      }
    }
  }
  return pcVar6;
}

Assistant:

char* pp_get_token()
{
    static char buf[1024];
    int len = 1;
    int termchar = 0;
    char* p = buf;

    /* end of line reached */
    if (l == '\n' || l == EOF)
        return NULL;

    /* eat up last token's last character */
    readbyte();

    /* skip spaces */
    while (l != '\n' && l != EOF && isspace(c))
        readbyte();

    /* no token */
    if (isspace(c) || c == EOF)
        return NULL;

    eline = line;
    ecolumn = column;

    if (c == '"')
        termchar = '"';

    len = 1;
    *p++ = c;
    while (l != EOF)
    {
        if (l == '\n')
            break;

        if (!termchar && isspace(l))
            break;

        readbyte();
        if (len < 1023)
        {
            *p++ = c;
            ++len;
        }

        if (termchar && c == termchar)
            break;
    }
    *p = 0;

    if (len >= 1023)
        ccerr(F, "too long line directive");

    return buf;
}